

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool duckdb::TryCastDecimalToNumeric<short,signed_char>
               (short input,char *result,CastParameters *parameters,uint8_t scale)

{
  string *msg;
  undefined7 in_register_00000009;
  undefined6 in_register_0000003a;
  long lVar1;
  string error;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  string local_40;
  
  lVar1 = (long)((-(ulong)((ushort)input >> 0xf) ^
                 *(ulong *)(NumericHelper::POWERS_OF_TEN +
                           (CONCAT71(in_register_00000009,scale) & 0xffffffff) * 8)) +
                (ulong)((ushort)input >> 0xf)) / 2;
  msg = (string *)
        (((int)CONCAT62(in_register_0000003a,input) + lVar1) /
        (long)*(ulong *)(NumericHelper::POWERS_OF_TEN +
                        (CONCAT71(in_register_00000009,scale) & 0xffffffff) * 8));
  if ((short)(char)msg == (short)msg) {
    *result = (char)msg;
  }
  else {
    local_60[0] = local_50;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_60,"Failed to cast decimal value %d to type %s","");
    Exception::ConstructMessage<long,duckdb::PhysicalType>
              (&local_40,(Exception *)local_60,msg,3,(PhysicalType)lVar1);
    if (local_60[0] != local_50) {
      operator_delete(local_60[0]);
    }
    HandleCastError::AssignError(&local_40,parameters);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return ((int)msg + 0x80U & 0xffff) < 0x100;
}

Assistant:

bool TryCastDecimalToNumeric(SRC input, DST &result, CastParameters &parameters, uint8_t scale) {
	// Round away from 0.
	const auto power = NumericHelper::POWERS_OF_TEN[scale];
	// https://graphics.stanford.edu/~seander/bithacks.html#ConditionalNegate
	const auto fNegate = int64_t(input < 0);
	const auto rounding = ((power ^ -fNegate) + fNegate) / 2;
	const auto scaled_value = (input + rounding) / power;
	if (!TryCast::Operation<SRC, DST>(UnsafeNumericCast<SRC>(scaled_value), result)) {
		string error = StringUtil::Format("Failed to cast decimal value %d to type %s", scaled_value, GetTypeId<DST>());
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	return true;
}